

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryCatch(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int n;
  CallFlags e;
  BOOL BVar5;
  ScriptContext *pSVar6;
  ThreadContext *pTVar7;
  Var *values;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptLibrary *this;
  RecyclableObject *pRVar10;
  JavascriptMethod p_Var11;
  CallInfo local_d0;
  CallInfo local_c8;
  undefined1 local_c0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  RecyclableObject *func;
  RecyclableObject *undefinedVar;
  Var onRejected;
  Var funcVar;
  RecyclableObject *local_80;
  RecyclableObject *promise;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  pTVar7 = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar7,0xc00,pSVar6,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x260,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x261,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  promise = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,
             L"Promise.prototype.catch",&stack0x00000000);
  pvVar9 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar5 = JavascriptConversion::ToObject(pvVar9,(ScriptContext *)__tag.entry.next,&local_80);
  if (BVar5 != 0) {
    pvVar9 = Js::JavascriptOperators::GetProperty
                       (local_80,0x169,(ScriptContext *)__tag.entry.next,(PropertyValueInfo *)0x0);
    bVar4 = JavascriptConversion::IsCallable(pvVar9);
    if (bVar4) {
      this = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
      pRVar10 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      undefinedVar = pRVar10;
      if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
        undefinedVar = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
      }
      autoReentrancyHandler._8_8_ = VarTo<Js::RecyclableObject>(pvVar9);
      pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_c0,pTVar7);
      pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar7);
      pTVar7 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
      ThreadContext::AssertJsReentrancy(pTVar7);
      uVar2 = autoReentrancyHandler._8_8_;
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
      CheckIsExecutable((RecyclableObject *)uVar2,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
      uVar2 = autoReentrancyHandler._8_8_;
      CallInfo::CallInfo(&local_c8,CallFlags_Value,3);
      uVar3 = autoReentrancyHandler._8_8_;
      CallInfo::CallInfo(&local_d0,CallFlags_Value,3);
      pvVar9 = (*p_Var11)((RecyclableObject *)uVar2,(CallInfo)uVar3,local_c8,0,0,0,0,local_d0,
                          local_80,pRVar10,undefinedVar);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_c0);
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70);
      return pvVar9;
    }
    JavascriptError::ThrowTypeError
              ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"Promise.prototype.catch");
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec41,L"Promise.prototype.catch");
}

Assistant:

Var JavascriptPromise::EntryCatch(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.prototype.catch"));

        RecyclableObject* promise;

        if (!JavascriptConversion::ToObject(args[0], scriptContext, &promise))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.prototype.catch"));
        }

        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);

        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.catch"));
        }

        Var onRejected;
        RecyclableObject* undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count > 1)
        {
            onRejected = args[1];
        }
        else
        {
            onRejected = undefinedVar;
        }

        RecyclableObject* func = VarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                    func, Js::CallInfo(CallFlags_Value, 3),
                    promise,
                    undefinedVar,
                    onRejected);
        }
        END_SAFE_REENTRANT_CALL
    }